

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O3

CURLcode easysrc_perform(void)

{
  CURLcode CVar1;
  long lVar2;
  curl_slist *pcVar3;
  
  if (easysrc_toohard == (slist_wc *)0x0) goto LAB_0010d05a;
  CVar1 = easysrc_add(&easysrc_code,"");
  if (CVar1 == CURLE_OK) {
    lVar2 = 0;
    do {
      CVar1 = easysrc_add(&easysrc_code,*(char **)((long)srchard + lVar2));
      if (lVar2 == 0x18) break;
      lVar2 = lVar2 + 8;
    } while (CVar1 == CURLE_OK);
    if ((easysrc_toohard == (slist_wc *)0x0) || (CVar1 != CURLE_OK)) {
LAB_0010d102:
      if (CVar1 != CURLE_OK) goto LAB_0010d03f;
    }
    else {
      pcVar3 = easysrc_toohard->first;
      if (pcVar3 != (curl_slist *)0x0) {
        do {
          CVar1 = easysrc_add(&easysrc_code,pcVar3->data);
          pcVar3 = pcVar3->next;
          if (pcVar3 == (curl_slist *)0x0) break;
        } while (CVar1 == CURLE_OK);
        goto LAB_0010d102;
      }
    }
    CVar1 = easysrc_add(&easysrc_code,"");
    if (CVar1 == CURLE_OK) {
      CVar1 = easysrc_add(&easysrc_code,"*/");
    }
  }
LAB_0010d03f:
  slist_wc_free_all(easysrc_toohard);
  easysrc_toohard = (slist_wc *)0x0;
  if (CVar1 != CURLE_OK) {
    easysrc_toohard = (slist_wc *)0x0;
    return CVar1;
  }
LAB_0010d05a:
  CVar1 = easysrc_add(&easysrc_code,"");
  if ((CVar1 == CURLE_OK) &&
     (CVar1 = easysrc_add(&easysrc_code,"ret = curl_easy_perform(hnd);"), CVar1 == CURLE_OK)) {
    CVar1 = easysrc_add(&easysrc_code,"");
    return CVar1;
  }
  return CVar1;
}

Assistant:

CURLcode easysrc_perform(void)
{
  CURLcode ret = CURLE_OK;
  /* Note any setopt calls which we could not convert */
  if(easysrc_toohard) {
    int i;
    struct curl_slist *ptr;
    ret = easysrc_add(&easysrc_code, "");
    /* Preamble comment */
    for(i = 0; srchard[i] && !ret; i++)
      ret = easysrc_add(&easysrc_code, srchard[i]);
    /* Each unconverted option */
    if(easysrc_toohard && !ret) {
      for(ptr = easysrc_toohard->first; ptr && !ret; ptr = ptr->next)
        ret = easysrc_add(&easysrc_code, ptr->data);
    }
    if(!ret)
      ret = easysrc_add(&easysrc_code, "");
    if(!ret)
      ret = easysrc_add(&easysrc_code, "*/");

    slist_wc_free_all(easysrc_toohard);
    easysrc_toohard = NULL;
  }

  if(!ret)
    ret = easysrc_add(&easysrc_code, "");
  if(!ret)
    ret = easysrc_add(&easysrc_code, "ret = curl_easy_perform(hnd);");
  if(!ret)
    ret = easysrc_add(&easysrc_code, "");

  return ret;
}